

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSender.h
# Opt level: O1

void __thiscall jaegertracing::ThriftSender::~ThriftSender(ThriftSender *this)

{
  *(undefined **)this = &typeinfo;
  (*_close)();
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x90) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x90));
  }
  if (*(long **)(this + 0x80) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x80) + 8))();
  }
  *(undefined8 *)(this + 0x80) = 0;
  jaegertracing::thrift::Process::~Process((Process *)(this + 0x30));
  std::vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_>::~vector
            ((vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_> *)
             (this + 0x18));
  if (*(long **)(this + 8) != (long *)0x0) {
    (**(code **)(**(long **)(this + 8) + 8))();
  }
  *(undefined8 *)(this + 8) = 0;
  return;
}

Assistant:

~ThriftSender() { close(); }